

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformdatabuilder.cpp
# Opt level: O2

QHttpPart __thiscall
QFormDataPartBuilderPrivate::build(QFormDataPartBuilderPrivate *this,Options options)

{
  short sVar1;
  ushort uVar2;
  long lVar3;
  long lVar4;
  qsizetype qVar5;
  uint in_EDX;
  long lVar6;
  qsizetype i;
  long lVar7;
  undefined4 in_register_00000034;
  PrivateShared *pPVar8;
  char *s;
  int iVar9;
  qsizetype end;
  PrivateShared *this_00;
  qsizetype i_1;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar10;
  long in_FS_OFFSET;
  QAnyStringView in;
  QStringView QVar11;
  QStringView QVar12;
  QByteArrayView local_c8;
  qsizetype local_b8;
  QMimeDatabase db;
  char *pcStack_a0;
  QArrayDataPointer<char> local_90;
  QArrayDataPointer<char> local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  pPVar8 = (PrivateShared *)
           CONCAT44(in_register_00000034,
                    options.super_QFlagsStorageHelper<QFormDataBuilder::Option,_4>.
                    super_QFlagsStorage<QFormDataBuilder::Option>.i);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->m_name).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QHttpPart::QHttpPart((QHttpPart *)this);
  local_78.d = (Data *)0x0;
  local_78.ptr = (char *)0x0;
  local_78.size = 0;
  QByteArray::append((QByteArray *)&local_78,"form-data; name=\"");
  lVar6 = *(long *)(pPVar8 + 8);
  lVar3 = *(long *)(pPVar8 + 0x10);
  lVar4 = 0;
  for (lVar7 = 0; lVar3 != lVar7; lVar7 = lVar7 + 1) {
    sVar1 = *(short *)(lVar6 + lVar7 * 2);
    if ((sVar1 == 0x5c) || (sVar1 == 0x22)) {
      QVar11.m_data = (storage_type_conflict *)(lVar7 - lVar4);
      QVar11.m_size = (qsizetype)&local_58;
      QUtf8::convertFromUnicode(QVar11);
      QByteArray::append((QByteArray *)&local_78);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
      QByteArray::append((char)&local_78);
      lVar4 = lVar7;
    }
  }
  QVar12.m_data = (storage_type_conflict *)(lVar3 - lVar4);
  QVar12.m_size = (qsizetype)&local_58;
  QUtf8::convertFromUnicode(QVar12);
  QByteArray::append((QByteArray *)&local_78);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
  QByteArray::append((QByteArray *)&local_78,"\"");
  if (*(long *)(pPVar8 + 0x38) != 0) {
    iVar9 = 0;
    for (lVar6 = 0; *(long *)(pPVar8 + 0x40) * 2 != lVar6; lVar6 = lVar6 + 2) {
      uVar2 = *(ushort *)(*(long *)(pPVar8 + 0x38) + lVar6);
      if (0xff < uVar2) {
        iVar9 = 2;
        break;
      }
      if (0x7f < uVar2) {
        iVar9 = 1;
      }
    }
    local_58.shared = (PrivateShared *)0x0;
    local_58._8_8_ = 0;
    local_58._16_8_ = 0;
    if (((in_EDX & 4) == 0) || (iVar9 == 2)) {
      QString::toUtf8_helper((QString *)&local_90);
      local_58.shared = (PrivateShared *)local_90.d;
      qVar5 = local_90.size;
      aVar10.m_data_utf8 = local_90.ptr;
    }
    else {
      QString::toLatin1_helper((QString *)&local_90);
      local_58.shared = (PrivateShared *)local_90.d;
      qVar5 = local_90.size;
      aVar10.m_data_utf8 = local_90.ptr;
    }
    local_90.d = (Data *)0x0;
    local_90.ptr = (char *)0x0;
    local_90.size = 0;
    local_58._8_8_ = aVar10;
    local_58._16_8_ = qVar5;
    QArrayDataPointer<char>::~QArrayDataPointer(&local_90);
    QByteArray::append((QByteArray *)&local_78,"; filename=\"");
    if ((in_EDX & 2) == 0) {
      for (lVar6 = 0; qVar5 != lVar6; lVar6 = lVar6 + 1) {
        if ((*(QMimeDatabase *)((long)aVar10.m_data + lVar6) == (QMimeDatabase)0x5c) ||
           (*(QMimeDatabase *)((long)aVar10.m_data + lVar6) == (QMimeDatabase)0x22)) {
          QByteArray::append((char)&local_78);
        }
        QByteArray::append((char)&local_78);
      }
    }
    else {
      _db = (QLatin1StringView)ZEXT816(0);
      local_c8 = (QByteArrayView)ZEXT816(0);
      local_b8 = 0;
      QByteArray::toPercentEncoding
                ((QByteArray *)&local_90,(QByteArray *)&local_58,
                 (char)(QArrayDataPointer<char> *)&db);
      QByteArray::append((QByteArray *)&local_78);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_90);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_c8);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&db);
    }
    QByteArray::append((QByteArray *)&local_78,"\"");
    if ((in_EDX & 1) == 0 && iVar9 != 0) {
      s = "; filename*=ISO-8859-1\'\'";
      if (iVar9 != 1) {
        s = "; filename*=UTF-8\'\'";
      }
      if ((in_EDX & 4) == 0) {
        s = "; filename*=UTF-8\'\'";
      }
      QByteArray::append((QByteArray *)&local_78,s);
      _db = (QLatin1StringView)ZEXT816(0);
      local_c8 = (QByteArrayView)ZEXT816(0);
      local_b8 = 0;
      QByteArray::toPercentEncoding
                ((QByteArray *)&local_90,(QByteArray *)&local_58,
                 (char)(QArrayDataPointer<char> *)&db);
      QByteArray::append((QByteArray *)&local_78);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_90);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_c8);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&db);
    }
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
  }
  if (*(long *)(pPVar8 + 0x28) == 0) {
    _db = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QMimeDatabase::QMimeDatabase(&db);
    local_90.d = (Data *)pPVar8;
    local_90.ptr = (char *)&db;
    if ((long)(char)pPVar8[0x68] == -1) {
      abort();
    }
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__deduce_visit_result<QMimeType>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/network/access/qformdatabuilder.cpp:316:44)_&&,_std::variant<QIODevice_*,_QByteArray>_&>
      ::_S_vtable._M_arr[(char)pPVar8[0x68]]._M_data)
              ((QMimeType *)&local_c8,(anon_class_16_2_e8807ff9 *)&local_90,
               (variant<QIODevice_*,_QByteArray> *)(pPVar8 + 0x50));
    QMimeType::name();
    in.m_size = local_58._16_8_ + 0x8000000000000000;
    in.field_0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)local_58._8_8_;
    convertInto((QByteArray *)(pPVar8 + 0x18),in);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
    QMimeType::~QMimeType((QMimeType *)&local_c8);
    QMimeDatabase::~QMimeDatabase(&db);
  }
  this_00 = pPVar8 + 0x48;
  lVar6 = 0;
  while( true ) {
    qVar5 = QHttpHeaders::size((QHttpHeaders *)this_00);
    if (qVar5 <= lVar6) break;
    _db = QHttpHeaders::nameAt((QHttpHeaders *)this_00,lVar6);
    QByteArrayView::toByteArray((QByteArray *)&local_58,(QByteArrayView *)&db);
    local_c8 = QHttpHeaders::valueAt((QHttpHeaders *)this_00,lVar6);
    QByteArrayView::toByteArray((QByteArray *)&local_90,&local_c8);
    QHttpPart::setRawHeader((QHttpPart *)this,(QByteArray *)&local_58,(QByteArray *)&local_90);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_90);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
    lVar6 = lVar6 + 1;
  }
  if (*(long *)(pPVar8 + 0x28) != 0) {
    QVariant::QVariant((QVariant *)&local_58,(QByteArray *)(pPVar8 + 0x18));
    QHttpPart::setHeader((QHttpPart *)this,ContentTypeHeader,(QVariant *)&local_58);
    QVariant::~QVariant((QVariant *)&local_58);
  }
  QVariant::QVariant((QVariant *)&local_58,(QByteArray *)&local_78);
  QHttpPart::setHeader((QHttpPart *)this,ContentDispositionHeader,(QVariant *)&local_58);
  QVariant::~QVariant((QVariant *)&local_58);
  if (pPVar8[0x68] == (PrivateShared)0x0) {
    QHttpPart::setBodyDevice((QHttpPart *)this,*(QIODevice **)(pPVar8 + 0x50));
  }
  else {
    QHttpPart::setBody((QHttpPart *)this,(QByteArray *)(pPVar8 + 0x50));
  }
  QArrayDataPointer<char>::~QArrayDataPointer(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QSharedDataPointer<QHttpPartPrivate>)(QSharedDataPointer<QHttpPartPrivate>)this;
  }
  __stack_chk_fail();
}

Assistant:

QHttpPart QFormDataPartBuilderPrivate::build(QFormDataBuilder::Options options)
{
    QHttpPart httpPart;

    using Opt = QFormDataBuilder::Option;

    QByteArray headerValue;

    headerValue += "form-data; name=\"";
    escapeNameAndAppend(headerValue, m_name);
    headerValue += "\"";

    if (!m_originalBodyName.isNull()) {

        enum class Encoding { ASCII, Latin1, Utf8 } encoding = Encoding::ASCII;
        for (QChar c : std::as_const(m_originalBodyName)) {
            if (c > u'\xff') {
                encoding = Encoding::Utf8;
                break;
            } else if (c > u'\x7f') {
                encoding = Encoding::Latin1;
            }
        }
        QByteArray enc;
        if ((options & Opt::PreferLatin1EncodedFilename) && encoding != Encoding::Utf8)
            enc = m_originalBodyName.toLatin1();
        else
            enc = m_originalBodyName.toUtf8();

        headerValue += "; filename=\"";
        if (options & Opt::UseRfc7578PercentEncodedFilename)
            headerValue += enc.toPercentEncoding();
        else
            escapeNameAndAppend(headerValue, enc);
        headerValue += "\"";
        if (encoding != Encoding::ASCII && !(options & Opt::OmitRfc8187EncodedFilename)) {
            // For 'filename*' production see
            // https://datatracker.ietf.org/doc/html/rfc5987#section-3.2.1
            // For providing both filename and filename* parameters see
            // https://datatracker.ietf.org/doc/html/rfc6266#section-4.3 and
            // https://datatracker.ietf.org/doc/html/rfc8187#section-4.2
            if ((options & Opt::PreferLatin1EncodedFilename) && encoding == Encoding::Latin1)
                headerValue += "; filename*=ISO-8859-1''";
            else
                headerValue += "; filename*=UTF-8''";
            headerValue += enc.toPercentEncoding();
        }
    }

#if QT_CONFIG(mimetype)
    if (m_mimeType.isEmpty()) {
        // auto-detect
        QMimeDatabase db;
        convertInto(m_mimeType, std::visit([&](auto &arg) {
                return db.mimeTypeForFileNameAndData(m_originalBodyName, arg);
            }, m_body).name());
    }
#endif

    for (qsizetype i = 0; i < m_httpHeaders.size(); i++) {
        httpPart.setRawHeader(QByteArrayView(m_httpHeaders.nameAt(i)).toByteArray(),
                                             m_httpHeaders.valueAt(i).toByteArray());
    }

    if (!m_mimeType.isEmpty())
        httpPart.setHeader(QNetworkRequest::ContentTypeHeader, m_mimeType);

    httpPart.setHeader(QNetworkRequest::ContentDispositionHeader, std::move(headerValue));

    if (auto d = std::get_if<QIODevice*>(&m_body))
        httpPart.setBodyDevice(*d);
    else if (auto b = std::get_if<QByteArray>(&m_body))
        httpPart.setBody(*b);
    else
        Q_UNREACHABLE();

    return httpPart;
}